

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O2

bool Catch::operator==(Optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *a,Optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *b)

{
  __type_conflict _Var1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  
  if (b->nullableValue == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      || a->nullableValue ==
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    return a->nullableValue ==
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0 &&
           b->nullableValue ==
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  __lhs = Optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator*(a);
  __rhs = Optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator*(b);
  _Var1 = std::operator==(__lhs,__rhs);
  return _Var1;
}

Assistant:

bool operator==(Optional const& a, Optional const& b) {
            if (a.none() && b.none()) {
                return true;
            } else if (a.some() && b.some()) {
                return *a == *b;
            } else {
                return false;
            }
        }